

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int testCore(void)

{
  bool_t bVar1;
  bool_t bVar2;
  bool_t bVar3;
  bool_t bVar4;
  bool_t bVar5;
  bool_t bVar6;
  bool_t bVar7;
  bool_t bVar8;
  bool_t bVar9;
  bool_t bVar10;
  bool_t bVar11;
  bool_t bVar12;
  bool_t bVar13;
  bool_t bVar14;
  bool_t bVar15;
  bool_t bVar16;
  bool_t bVar17;
  bool_t bVar18;
  bool_t bVar19;
  char *pcVar20;
  int ret;
  bool_t code;
  
  bVar1 = apduTest();
  pcVar20 = "Err";
  if (bVar1 != 0) {
    pcVar20 = "OK";
  }
  printf("apduTest: %s\n",pcVar20);
  bVar2 = b64Test();
  pcVar20 = "Err";
  if (bVar2 != 0) {
    pcVar20 = "OK";
  }
  printf("b64Test: %s\n",pcVar20);
  bVar3 = blobTest();
  pcVar20 = "Err";
  if (bVar3 != 0) {
    pcVar20 = "OK";
  }
  printf("blobTest: %s\n",pcVar20);
  bVar4 = decTest();
  pcVar20 = "Err";
  if (bVar4 != 0) {
    pcVar20 = "OK";
  }
  printf("decTest: %s\n",pcVar20);
  bVar5 = derTest();
  pcVar20 = "Err";
  if (bVar5 != 0) {
    pcVar20 = "OK";
  }
  printf("derTest: %s\n",pcVar20);
  bVar6 = fileTest();
  pcVar20 = "Err";
  if (bVar6 != 0) {
    pcVar20 = "OK";
  }
  printf("fileTest: %s\n",pcVar20);
  bVar7 = hexTest();
  pcVar20 = "Err";
  if (bVar7 != 0) {
    pcVar20 = "OK";
  }
  printf("hexTest: %s\n",pcVar20);
  bVar8 = memTest();
  pcVar20 = "Err";
  if (bVar8 != 0) {
    pcVar20 = "OK";
  }
  printf("memTest: %s\n",pcVar20);
  bVar9 = mtTest();
  pcVar20 = "Err";
  if (bVar9 != 0) {
    pcVar20 = "OK";
  }
  printf("mtTest: %s\n",pcVar20);
  bVar10 = objTest();
  pcVar20 = "Err";
  if (bVar10 != 0) {
    pcVar20 = "OK";
  }
  printf("objTest: %s\n",pcVar20);
  bVar11 = oidTest();
  pcVar20 = "Err";
  if (bVar11 != 0) {
    pcVar20 = "OK";
  }
  printf("oidTest: %s\n",pcVar20);
  bVar12 = prngTest();
  pcVar20 = "Err";
  if (bVar12 != 0) {
    pcVar20 = "OK";
  }
  printf("genTest: %s\n",pcVar20);
  bVar13 = rngTest();
  pcVar20 = "Err";
  if (bVar13 != 0) {
    pcVar20 = "OK";
  }
  printf("rngTest: %s\n",pcVar20);
  bVar14 = strTest();
  pcVar20 = "Err";
  if (bVar14 != 0) {
    pcVar20 = "OK";
  }
  printf("strTest: %s\n",pcVar20);
  bVar15 = tmTest();
  pcVar20 = "Err";
  if (bVar15 != 0) {
    pcVar20 = "OK";
  }
  printf("tmTest: %s\n",pcVar20);
  bVar16 = u16Test();
  pcVar20 = "Err";
  if (bVar16 != 0) {
    pcVar20 = "OK";
  }
  printf("u16Test: %s\n",pcVar20);
  bVar17 = u32Test();
  pcVar20 = "Err";
  if (bVar17 != 0) {
    pcVar20 = "OK";
  }
  printf("u32Test: %s\n",pcVar20);
  bVar18 = u64Test();
  pcVar20 = "Err";
  if (bVar18 != 0) {
    pcVar20 = "OK";
  }
  printf("u64Test: %s\n",pcVar20);
  bVar19 = utilTest();
  pcVar20 = "Err";
  if (bVar19 != 0) {
    pcVar20 = "OK";
  }
  printf("utilTest: %s\n",pcVar20);
  return (uint)(byte)((bVar19 != 0 ^ 0xffU) & 1 |
                     (bVar18 != 0 ^ 0xffU) & 1 |
                     (bVar17 != 0 ^ 0xffU) & 1 |
                     (bVar16 != 0 ^ 0xffU) & 1 |
                     (bVar15 != 0 ^ 0xffU) & 1 |
                     (bVar14 != 0 ^ 0xffU) & 1 |
                     (bVar13 != 0 ^ 0xffU) & 1 |
                     (bVar12 != 0 ^ 0xffU) & 1 |
                     (bVar11 != 0 ^ 0xffU) & 1 |
                     (bVar10 != 0 ^ 0xffU) & 1 |
                     (bVar9 != 0 ^ 0xffU) & 1 |
                     (bVar8 != 0 ^ 0xffU) & 1 |
                     (bVar7 != 0 ^ 0xffU) & 1 |
                     (bVar6 != 0 ^ 0xffU) & 1 |
                     (bVar5 != 0 ^ 0xffU) & 1 |
                     (bVar4 != 0 ^ 0xffU) & 1 |
                     (bVar3 != 0 ^ 0xffU) & 1 | (bVar2 != 0 ^ 0xffU) & 1 | (bVar1 != 0 ^ 0xffU) & 1)
  ;
}

Assistant:

int testCore()
{
	bool_t code;
	int ret = 0;
	printf("apduTest: %s\n", (code = apduTest()) ? "OK" : "Err"), ret |= !code;
	printf("b64Test: %s\n", (code = b64Test()) ? "OK" : "Err"), ret |= !code;
	printf("blobTest: %s\n", (code = blobTest()) ? "OK" : "Err"), ret |= !code;
	printf("decTest: %s\n", (code = decTest()) ? "OK" : "Err"), ret |= !code;
	printf("derTest: %s\n", (code = derTest()) ? "OK" : "Err"), ret |= !code;
	printf("fileTest: %s\n", (code = fileTest()) ? "OK" : "Err"), ret |= !code;
	printf("hexTest: %s\n", (code = hexTest()) ? "OK" : "Err"), ret |= !code;
	printf("memTest: %s\n", (code = memTest()) ? "OK" : "Err"), ret |= !code;
	printf("mtTest: %s\n", (code = mtTest()) ? "OK" : "Err"), ret |= !code;
	printf("objTest: %s\n", (code = objTest()) ? "OK" : "Err"), ret |= !code;
	printf("oidTest: %s\n", (code = oidTest()) ? "OK" : "Err"), ret |= !code;
	printf("genTest: %s\n", (code = prngTest()) ? "OK" : "Err"), ret |= !code;
	printf("rngTest: %s\n", (code = rngTest()) ? "OK" : "Err"), ret |= !code;
	printf("strTest: %s\n", (code = strTest()) ? "OK" : "Err"), ret |= !code;
	printf("tmTest: %s\n", (code = tmTest()) ? "OK" : "Err"), ret |= !code;
	printf("u16Test: %s\n", (code = u16Test()) ? "OK" : "Err"), ret |= !code;
	printf("u32Test: %s\n", (code = u32Test()) ? "OK" : "Err"), ret |= !code;
	printf("u64Test: %s\n", (code = u64Test()) ? "OK" : "Err"), ret |= !code;
	printf("utilTest: %s\n", (code = utilTest()) ? "OK" : "Err"), ret |= !code;
	return ret;
}